

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cpp
# Opt level: O2

void CDiv(double ar,double ai,double br,double bi,double *cr,double *ci)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  
  auVar11._8_56_ = in_register_000012c8;
  auVar11._0_8_ = bi;
  auVar9._8_56_ = in_register_00001288;
  auVar9._0_8_ = br;
  auVar6._8_56_ = in_register_00001248;
  auVar6._0_8_ = ai;
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = ar;
  auVar12._8_8_ = 0x7fffffffffffffff;
  auVar12._0_8_ = 0x7fffffffffffffff;
  auVar3 = vunpcklpd_avx(auVar5._0_16_,auVar9._0_16_);
  auVar4 = vunpcklpd_avx(auVar6._0_16_,auVar11._0_16_);
  auVar2 = vandpd_avx(auVar9._0_16_,auVar12);
  auVar7 = vandpd_avx(auVar11._0_16_,auVar12);
  dVar1 = auVar2._0_8_ + auVar7._0_8_;
  auVar7._8_8_ = dVar1;
  auVar7._0_8_ = dVar1;
  auVar2 = vdivpd_avx(auVar4,auVar7);
  auVar7 = vdivpd_avx(auVar3,auVar7);
  auVar3 = vshufpd_avx(auVar2,auVar2,3);
  auVar4 = vshufpd_avx(auVar7,auVar7,3);
  auVar8._0_8_ = auVar3._0_8_ * auVar2._0_8_;
  auVar8._8_8_ = auVar3._8_8_ * auVar2._8_8_;
  auVar4 = vfmadd213pd_fma(auVar4,auVar7,auVar8);
  auVar3 = vshufpd_avx(auVar4,auVar4,1);
  *cr = auVar4._0_8_ / auVar3._0_8_;
  auVar4 = vshufpd_avx(auVar2,auVar2,1);
  auVar8 = vshufpd_avx(auVar7,auVar7,1);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar4._0_8_ * auVar7._0_8_;
  auVar2 = vfmsub213sd_fma(auVar8,auVar2,auVar10);
  *ci = auVar2._0_8_ / auVar3._0_8_;
  return;
}

Assistant:

void CDiv (double ar, double ai, double br, double bi, double *cr, double *ci)

{
	double		s, ais, bis, ars, brs;

	s = fabs(br) + fabs(bi);
	ars = ar / s;
	ais = ai / s;
	brs = br / s;
	bis = bi / s;
	s = brs*brs + bis*bis;
	*cr = (ars*brs + ais*bis) / s;
	*ci = (ais*brs - ars*bis) / s;
}